

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

uint32_t __thiscall
duckdb::ParquetReader::ReadData
          (ParquetReader *this,TProtocol *iprot,data_ptr_t buffer,uint32_t buffer_size)

{
  bool bVar1;
  ParquetEncryptionConfig *this_00;
  element_type *this_01;
  ssize_t sVar2;
  ulong in_RCX;
  ulong __nbytes;
  int in_EDX;
  EncryptionUtil *unaff_retaddr;
  string *in_stack_00000008;
  uint32_t in_stack_00000014;
  data_ptr_t in_stack_00000018;
  TProtocol *in_stack_00000020;
  TProtocol *in_stack_ffffffffffffff78;
  shared_ptr<duckdb::EncryptionUtil,_true> *in_stack_ffffffffffffff80;
  undefined4 local_4;
  
  __nbytes = in_RCX;
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)0x69f1e4);
  if (bVar1) {
    this_00 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                        ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)
                         in_stack_ffffffffffffff80);
    ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_00);
    shared_ptr<duckdb::EncryptionUtil,_true>::operator*(in_stack_ffffffffffffff80);
    local_4 = ParquetCrypto::ReadData
                        (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008,
                         unaff_retaddr);
  }
  else {
    duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffff78);
    this_01 = std::
              __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x69f27b);
    sVar2 = duckdb_apache::thrift::transport::TTransport::read
                      (this_01,in_EDX,(void *)(in_RCX & 0xffffffff),__nbytes);
    local_4 = (uint32_t)sVar2;
    std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x69f2a7);
  }
  return local_4;
}

Assistant:

uint32_t ParquetReader::ReadData(duckdb_apache::thrift::protocol::TProtocol &iprot, const data_ptr_t buffer,
                                 const uint32_t buffer_size) {
	if (parquet_options.encryption_config) {
		return ParquetCrypto::ReadData(iprot, buffer, buffer_size, parquet_options.encryption_config->GetFooterKey(),
		                               *encryption_util);
	} else {
		return iprot.getTransport()->read(buffer, buffer_size);
	}
}